

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_DACCtrl_PlayData_Loc(VGMPlayer *this)

{
  UINT8 LenMode;
  UINT32 DataPos;
  UINT32 Length;
  UINT8 *pUVar1;
  size_t sVar2;
  pointer pDVar3;
  ulong uVar4;
  
  pUVar1 = this->_fileData;
  uVar4 = (ulong)this->_filePos;
  sVar2 = this->_dacStrmMap[pUVar1[uVar4 + 1]];
  if (sVar2 != 0xffffffffffffffff) {
    pDVar3 = (this->_dacStreams).
             super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    DataPos = *(UINT32 *)(pUVar1 + uVar4 + 2);
    Length = *(UINT32 *)(pUVar1 + uVar4 + 7);
    pDVar3[sVar2].lastItem = 0xffffffff;
    LenMode = pUVar1[uVar4 + 6];
    pDVar3[sVar2].pbMode = LenMode;
    daccontrol_start(pDVar3[sVar2].defInf.dataPtr,DataPos,LenMode,Length);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_PlayData_Loc(void)	// DAC Stream Control: Play Data (verbose, by specifying location/size)
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
		return;
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	
	UINT32 startOfs = ReadLE32(&fData[0x02]);
	UINT32 soundLen = ReadLE32(&fData[0x07]);
	dacStrm->lastItem = (UINT32)-1;
	dacStrm->pbMode = fData[0x06];
	daccontrol_start(dacStrm->defInf.dataPtr, startOfs, dacStrm->pbMode, soundLen);
	return;
}